

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::SharedCtor(TreeEnsembleRegressor *this)

{
  this->treeensemble_ = (TreeEnsembleParameters *)0x0;
  this->postevaluationtransform_ = 0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void TreeEnsembleRegressor::SharedCtor() {
  ::memset(&treeensemble_, 0, reinterpret_cast<char*>(&postevaluationtransform_) -
    reinterpret_cast<char*>(&treeensemble_) + sizeof(postevaluationtransform_));
  _cached_size_ = 0;
}